

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_registry.hxx
# Opt level: O2

void cryptox::test::test_vector_registry<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_>::
     test_vector(string *input,string *expected)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  array<unsigned_char,_28UL> *container;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>_> digester;
  char *local_a8;
  char *local_a0;
  undefined **local_98;
  undefined1 local_90;
  undefined8 *local_88;
  char *local_80;
  string local_78;
  digest_type actual;
  char *local_28;
  char *local_20;
  
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  ::evp_message_digest_context
            ((evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
              *)&digester);
  first._M_current = (input->_M_dataplus)._M_p;
  basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,224ul>>::operator()
            ((basic_message_digester<cryptox::message_digest_algorithm<&EVP_sha224,224ul>> *)
             &digester,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(first._M_current + input->_M_string_length),actual._M_elems);
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
  ;
  local_20 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_28,0x2a);
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_002b7238;
  local_88 = &boost::unit_test::lazy_ostream::inst;
  local_80 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/message_digests/test_vector_registry.hxx"
  ;
  local_a0 = "";
  to_hex<std::array<unsigned_char,28ul>>(&local_78,(cryptox *)&actual,container);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_98,&local_a8,0x2a,1,2,&local_78,"to_hex(actual)",expected,"expected");
  std::__cxx11::string::~string((string *)&local_78);
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  ::~evp_message_digest_context
            (&digester.
              super_evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha224,_224UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
            );
  return;
}

Assistant:

static void test_vector(const std::string& input,
		                        const std::string& expected) {

			typename Algorithm::digest_type actual;

			basic_message_digester<Algorithm> digester;
			digester(input.begin(), input.end(), actual.begin());

			BOOST_CHECK_EQUAL(to_hex(actual), expected);
		}